

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

VMFunction * __thiscall FxVMFunctionCall::GetDirectFunction(FxVMFunctionCall *this)

{
  uint uVar1;
  Variant *pVVar2;
  uint uVar3;
  
  if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
    pVVar2 = (this->Function->Variants).Array;
    uVar1 = pVVar2->Flags;
    if ((uVar1 >> 8 & 1) == 0) {
      uVar3 = 3;
      if ((uVar1 & 4) == 0) {
        uVar3 = uVar1 >> 1 & 1;
      }
      if (((pVVar2->ArgFlags).Count <= uVar3) || (((pVVar2->ArgFlags).Array[uVar3] & 1) != 0)) {
        return pVVar2->Implementation;
      }
    }
  }
  return (VMFunction *)0x0;
}

Assistant:

VMFunction *FxVMFunctionCall::GetDirectFunction()
{
	// If this return statement calls a non-virtual function with no arguments,
	// then it can be a "direct" function. That is, the DECORATE
	// definition can call that function directly without wrapping
	// it inside VM code.
	if (ArgList.Size() == 0 && !(Function->Variants[0].Flags & VARF_Virtual))
	{
		unsigned imp = Function->GetImplicitArgs();
		if (Function->Variants[0].ArgFlags.Size() > imp && !(Function->Variants[0].ArgFlags[imp] & VARF_Optional)) return nullptr;
		return Function->Variants[0].Implementation;
	}
	
	return nullptr;
}